

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall RoleMaskProxyModel::setMergeDisplayEdit(RoleMaskProxyModel *this,bool val)

{
  initializer_list<int> args;
  qsizetype this_00;
  bool bVar1;
  MaskedItem *container;
  iterator o;
  QMap<int,_QVariant> *pQVar2;
  QModelIndex local_f8;
  QMap<int,_QVariant> *local_e0;
  iterator local_d8;
  iterator idxEnd_2;
  iterator idxIter_2;
  iterator idxEnd_1;
  iterator idxIter_1;
  int local_98;
  char local_94 [4];
  undefined1 local_90 [8];
  iterator idxEnd;
  undefined1 local_68 [8];
  iterator idxIter;
  undefined1 local_38 [8];
  QVector<int> changedRoles;
  RoleMaskProxyModelPrivate *d;
  anon_class_1_1_ba1d8281 setMergeDisplayEditContainer;
  RoleMaskProxyModel *pRStack_10;
  bool val_local;
  RoleMaskProxyModel *this_local;
  
  d._6_1_ = val;
  d._7_1_ = val;
  pRStack_10 = this;
  changedRoles.d.size = (qsizetype)d_func(this);
  if ((((RoleMaskProxyModelPrivate *)changedRoles.d.size)->m_mergeDisplayEdit & 1U) != (d._7_1_ & 1)
     ) {
    idxIter.e._0_4_ = 0;
    idxIter.e._4_4_ = 2;
    args._M_len = 2;
    args._M_array = (iterator)&idxIter.e;
    QList<int>::QList((QList<int> *)local_38,args);
    *(byte *)(changedRoles.d.size + 0x89) = d._7_1_ & 1;
    QMultiHash<std::pair<int,_int>,_MaskedItem>::begin
              ((iterator *)local_68,
               (QMultiHash<std::pair<int,_int>,_MaskedItem> *)(changedRoles.d.size + 0x10));
    QMultiHash<std::pair<int,_int>,_MaskedItem>::end
              ((iterator *)local_90,
               (QMultiHash<std::pair<int,_int>,_MaskedItem> *)(changedRoles.d.size + 0x10));
    while (bVar1 = QMultiHash<std::pair<int,_int>,_MaskedItem>::iterator::operator!=
                             ((iterator *)local_68,(iterator *)local_90), bVar1) {
      container = QMultiHash<std::pair<int,_int>,_MaskedItem>::iterator::operator->
                            ((iterator *)local_68);
      setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                ((anon_class_1_1_ba1d8281 *)((long)&d + 6),(RolesContainer *)container);
      QMultiHash<std::pair<int,_int>,_MaskedItem>::iterator::operator++((iterator *)local_68);
    }
    if ((d._7_1_ & 1) == 0) {
      local_98 = 0;
      bVar1 = QSet<int>::contains((QSet<int> *)(changedRoles.d.size + 8),&local_98);
      if (bVar1) {
        QSet<int>::insert((QSet<int> *)&idxIter_1,(int *)(changedRoles.d.size + 8));
      }
    }
    else {
      local_94[0] = '\x02';
      local_94[1] = '\0';
      local_94[2] = '\0';
      local_94[3] = '\0';
      QSet<int>::remove((QSet<int> *)(changedRoles.d.size + 8),local_94);
    }
    if ((*(byte *)(changedRoles.d.size + 0x8a) & 1) != 0) {
      idxEnd_1 = QList<QMap<int,_QVariant>_>::begin
                           ((QList<QMap<int,_QVariant>_> *)(changedRoles.d.size + 0x20));
      o = QList<QMap<int,_QVariant>_>::end
                    ((QList<QMap<int,_QVariant>_> *)(changedRoles.d.size + 0x20));
      while (bVar1 = QList<QMap<int,_QVariant>_>::iterator::operator!=(&idxEnd_1,o), bVar1) {
        pQVar2 = QList<QMap<int,_QVariant>_>::iterator::operator*(&idxEnd_1);
        setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                  ((anon_class_1_1_ba1d8281 *)((long)&d + 6),pQVar2);
        QList<QMap<int,_QVariant>_>::iterator::operator++(&idxEnd_1);
      }
      idxEnd_2 = QList<QMap<int,_QVariant>_>::begin
                           ((QList<QMap<int,_QVariant>_> *)(changedRoles.d.size + 0x38));
      local_d8 = QList<QMap<int,_QVariant>_>::end
                           ((QList<QMap<int,_QVariant>_> *)(changedRoles.d.size + 0x38));
      while( true ) {
        local_e0 = local_d8.i;
        bVar1 = QList<QMap<int,_QVariant>_>::iterator::operator!=(&idxEnd_2,local_d8);
        if (!bVar1) break;
        pQVar2 = QList<QMap<int,_QVariant>_>::iterator::operator*(&idxEnd_2);
        setMergeDisplayEdit::anon_class_1_1_ba1d8281::operator()
                  ((anon_class_1_1_ba1d8281 *)((long)&d + 6),pQVar2);
        QList<QMap<int,_QVariant>_>::iterator::operator++(&idxEnd_2);
      }
    }
    mergeDisplayEditChanged(this,(bool)(*(byte *)(changedRoles.d.size + 0x89) & 1));
    this_00 = changedRoles.d.size;
    QModelIndex::QModelIndex(&local_f8);
    RoleMaskProxyModelPrivate::signalAllChanged
              ((RoleMaskProxyModelPrivate *)this_00,(QVector<int> *)local_38,&local_f8);
    QList<int>::~QList((QList<int> *)local_38);
  }
  return;
}

Assistant:

void RoleMaskProxyModel::setMergeDisplayEdit(bool val)
{
    const auto setMergeDisplayEditContainer = [val](RolesContainer &container) {
        if (val) {
            if (container.contains(Qt::DisplayRole)) {
                container.remove(Qt::EditRole);
            } else {
                const auto roleIter = container.constFind(Qt::EditRole);
                if (roleIter != container.constEnd()) {
                    container.insert(Qt::DisplayRole, *roleIter);
                    container.remove(Qt::EditRole);
                }
            }
        } else {
            const auto roleIter = container.constFind(Qt::DisplayRole);
            if (roleIter != container.constEnd()) {
                container.insert(Qt::EditRole, *roleIter);
            }
        }
    };
    Q_D(RoleMaskProxyModel);
    if (d->m_mergeDisplayEdit != val) {
        QVector<int> changedRoles({Qt::DisplayRole, Qt::EditRole});
        d->m_mergeDisplayEdit = val;
        for (auto idxIter = d->m_masked.begin(), idxEnd = d->m_masked.end(); idxIter != idxEnd; ++idxIter)
            setMergeDisplayEditContainer(idxIter->m_data.roles);
        if (val)
            d->m_maskedRoles.remove(Qt::EditRole);
        else if (d->m_maskedRoles.contains(Qt::DisplayRole))
            d->m_maskedRoles.insert(Qt::EditRole);
        if (d->m_maskHeaderData) {
            for (auto idxIter = d->m_hHeaderData.begin(), idxEnd = d->m_hHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
            for (auto idxIter = d->m_vHeaderData.begin(), idxEnd = d->m_vHeaderData.end(); idxIter != idxEnd; ++idxIter)
                setMergeDisplayEditContainer(*idxIter);
        }
        mergeDisplayEditChanged(d->m_mergeDisplayEdit);
        d->signalAllChanged(changedRoles);
    }
}